

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

var * __thiscall cs::domain_manager::get_var(domain_manager *this,string *name)

{
  stack_pointer psVar1;
  domain_type *pdVar2;
  domain_type *pdVar3;
  size_t sVar4;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar5;
  runtime_error *this_00;
  long *plVar6;
  size_type *psVar7;
  domain_type *domain;
  domain_type *pdVar8;
  var *unaff_R14;
  domain_type *domain_1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 != (stack_pointer)0x0) {
    pdVar2 = psVar1->m_start;
    pdVar3 = psVar1->m_current;
    do {
      pdVar8 = pdVar3;
      if (pdVar8 == pdVar2) goto LAB_001b7a69;
      pdVar3 = pdVar8 + -1;
      sVar4 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::count<std::__cxx11::string>
                        ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                          *)pdVar3,name);
    } while (sVar4 == 0);
    puVar5 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                         *)pdVar3,name);
    unaff_R14 = pdVar8[-1].m_slot.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                _M_impl.super__Vector_impl_data._M_start + *puVar5;
LAB_001b7a69:
    if (pdVar8 != pdVar2) {
      return unaff_R14;
    }
  }
  pdVar2 = (this->m_data).m_start;
  pdVar3 = (this->m_data).m_current;
  do {
    pdVar8 = pdVar3;
    if (pdVar8 == pdVar2) goto LAB_001b7ab6;
    pdVar3 = pdVar8 + -1;
    sVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)pdVar3,name);
  } while (sVar4 == 0);
  puVar5 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           ::
           at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                       *)pdVar3,name);
  unaff_R14 = pdVar8[-1].m_slot.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
              _M_impl.super__Vector_impl_data._M_start + *puVar5;
LAB_001b7ab6:
  if (pdVar8 != pdVar2) {
    return unaff_R14;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_50,"Use of undefined variable \"",name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar6[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
  }
  local_70._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  runtime_error::runtime_error(this_00,&local_70);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

inline var &get_var(const std::string &name)
		{
			if (fiber_stack != nullptr) {
				for (auto &domain: *fiber_stack)
					if (domain.exist(name))
						return domain.get_var_no_check(name);
			}
			for (auto &domain: m_data)
				if (domain.exist(name))
					return domain.get_var_no_check(name);
			throw runtime_error("Use of undefined variable \"" + name + "\".");
		}